

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

size_t __thiscall
CoreML::Specification::BatchnormLayerParams::ByteSizeLong(BatchnormLayerParams *this)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  
  if (this->gamma_ == (WeightParams *)0x0 ||
      this == (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    sVar3 = 0;
  }
  else {
    sVar3 = WeightParams::ByteSizeLong(this->gamma_);
    uVar6 = (uint)sVar3 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->beta_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->beta_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->mean_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->mean_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->variance_ != (WeightParams *)0x0 &&
      this != (BatchnormLayerParams *)&_BatchnormLayerParams_default_instance_) {
    sVar4 = WeightParams::ByteSizeLong(this->variance_);
    uVar6 = (uint)sVar4 | 1;
    iVar1 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar3 = sVar3 + sVar4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 2;
  }
  if (this->channels_ != 0) {
    uVar5 = this->channels_ | 1;
    lVar2 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3 + 2;
  if (this->computemeanvar_ == false) {
    sVar4 = sVar3;
  }
  sVar3 = sVar4 + 2;
  if (this->instancenormalization_ == false) {
    sVar3 = sVar4;
  }
  sVar4 = sVar3;
  if (this->epsilon_ != 0.0) {
    sVar4 = sVar3 + 5;
  }
  if (NAN(this->epsilon_)) {
    sVar4 = sVar3 + 5;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

size_t BatchnormLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchnormLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->has_gamma()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->has_beta()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->beta_);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->has_mean()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->mean_);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->has_variance()) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->variance_);
  }

  // uint64 channels = 1;
  if (this->channels() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt64Size(
        this->channels());
  }

  // bool computeMeanVar = 5;
  if (this->computemeanvar() != 0) {
    total_size += 1 + 1;
  }

  // bool instanceNormalization = 6;
  if (this->instancenormalization() != 0) {
    total_size += 1 + 1;
  }

  // float epsilon = 10;
  if (this->epsilon() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}